

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O1

w3Tag __thiscall w3Module::read_valuetype(w3Module *this,uint8_t **cursor)

{
  w3Tag wVar1;
  string local_30;
  
  wVar1 = ::read_byte(cursor,this->end);
  if ((char)wVar1 < '|') {
    StringFormat_abi_cxx11_(&local_30,"invalid w3Tag:%X",(ulong)wVar1);
    ThrowString(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return wVar1;
}

Assistant:

w3Tag w3Module::read_valuetype (uint8_t** cursor)
{
    const uint32_t value_type = read_byte (cursor);
    switch (value_type)
    {
    default:
        ThrowString (StringFormat ("invalid w3Tag:%X", value_type));
        break;
    case Tag_i32:
    case Tag_i64:
    case Tag_f32:
    case Tag_f64:
        break;
    }
    return (w3Tag)value_type;
}